

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3RunnerNonRecursive.hpp
# Opt level: O3

semantic_value_type __thiscall Centaurus::Stage3Runner::reduce(Stage3Runner *this)

{
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  *values;
  int n;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_> *tags;
  int *piVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  undefined8 *puVar5;
  CSTMarker *marker;
  pointer pSVar6;
  CSTMarker *marker_00;
  CSTMarker *pCVar7;
  int *piVar8;
  undefined8 uVar9;
  iterator values_next_it;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  undefined8 *local_38;
  
  puVar5 = (undefined8 *)acquire_bank(this);
  if (puVar5 == (undefined8 *)0x0) {
    __assert_fail("bank_base_ptr != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x34,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  tags = (vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
          *)*puVar5;
  if ((long)this->m_current_bank != -1) {
    LOCK();
    *(undefined4 *)
     ((long)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window +
     (long)this->m_current_bank * 8 + 4) = 0;
    UNLOCK();
    this->m_current_bank = -1;
  }
  values = tags + 1;
  puVar5 = (undefined8 *)acquire_bank(this);
  if (puVar5 != (undefined8 *)0x0) {
    do {
      local_38 = (undefined8 *)*puVar5;
      local_40._M_current = (unsigned_long *)local_38[3];
      marker = (CSTMarker *)local_38[9];
      piVar1 = (int *)local_38[1];
      marker_00 = (CSTMarker *)local_38[6];
      for (piVar8 = (int *)*local_38; puVar5 = local_38, piVar8 != piVar1; piVar8 = piVar8 + 1) {
        n = *piVar8;
        if (n == 0) {
          if (tags[3].
              super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              tags[3].
              super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("!starts.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                          ,0x58,"semantic_value_type Centaurus::Stage3Runner::reduce()");
          }
          pCVar7 = marker_00 + 1;
          NonRecursiveReductionRunner::reduce_by_end_marker
                    (&this->super_NonRecursiveReductionRunner,marker_00,
                     (vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *)
                     (tags + 3),(vector<unsigned_long,_std::allocator<unsigned_long>_> *)values,tags
                    );
        }
        else {
          pCVar7 = marker_00;
          if (n == -1) {
            NonRecursiveReductionRunner::push_start_marker
                      (marker,(vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *
                              )(tags + 3),tags);
            marker = marker + 1;
          }
          else {
            if (n < 1) {
              __assert_fail("detail::isValueTag(cur_tag)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                            ,0x5c,"semantic_value_type Centaurus::Stage3Runner::reduce()");
            }
            append_value<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (&local_40,n,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)values,
                       tags);
          }
        }
        marker_00 = pCVar7;
      }
      if (marker != (CSTMarker *)local_38[10]) {
        __assert_fail("starts_next_it == starts_next.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                      ,0x61,"semantic_value_type Centaurus::Stage3Runner::reduce()");
      }
      if (marker_00 != (CSTMarker *)local_38[7]) {
        __assert_fail("ends_next_it == ends_next.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                      ,0x62,"semantic_value_type Centaurus::Stage3Runner::reduce()");
      }
      if (local_40._M_current != (unsigned_long *)local_38[4]) {
        __assert_fail("values_next_it == values_next.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                      ,100,"semantic_value_type Centaurus::Stage3Runner::reduce()");
      }
      if ((void *)local_38[9] != (void *)0x0) {
        operator_delete((void *)local_38[9]);
      }
      if ((void *)puVar5[6] != (void *)0x0) {
        operator_delete((void *)puVar5[6]);
      }
      if ((void *)puVar5[3] != (void *)0x0) {
        operator_delete((void *)puVar5[3]);
      }
      if ((void *)*puVar5 != (void *)0x0) {
        operator_delete((void *)*puVar5);
      }
      operator_delete(puVar5);
      if ((long)this->m_current_bank != -1) {
        LOCK();
        *(undefined4 *)
         ((long)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window +
         (long)this->m_current_bank * 8 + 4) = 0;
        UNLOCK();
        this->m_current_bank = -1;
      }
      puVar5 = (undefined8 *)acquire_bank(this);
    } while (puVar5 != (undefined8 *)0x0);
  }
  pSVar2 = tags[3].
           super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar2 != tags[3].
                super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("starts.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x6b,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  pSVar6 = tags[2].
           super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar6 != tags[2].
                super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("ends.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x6c,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  pSVar3 = tags[1].
           super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = tags[1].
           super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)pSVar3 - (long)pSVar4)) {
    __assert_fail("values.size() <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x6d,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  if ((ulong)((long)(tags->
                    super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(tags->
                   super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 5) {
    if (pSVar4 == pSVar3) {
      uVar9 = END_MARKER;
    }
    else {
      uVar9 = *(undefined8 *)pSVar4;
    }
    if (pSVar2 != (pointer)0x0) {
      operator_delete(pSVar2);
      pSVar6 = tags[2].
               super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (pSVar6 != (pointer)0x0) {
      operator_delete(pSVar6);
    }
    pSVar2 = (values->
             super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pSVar2 != (pointer)0x0) {
      operator_delete(pSVar2);
    }
    pSVar2 = (tags->
             super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pSVar2 != (pointer)0x0) {
      operator_delete(pSVar2);
    }
    operator_delete(tags);
    return uVar9;
  }
  __assert_fail("tags.size() <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                ,0x6e,"semantic_value_type Centaurus::Stage3Runner::reduce()");
}

Assistant:

semantic_value_type reduce()
  {
#if PYCENTAURUS
    auto bank_ptr = reinterpret_cast<uint64_t*>(acquire_bank());
    assert(bank_ptr != nullptr);
    std::vector<CSTMarker> starts(*bank_ptr++, CSTMarker(0));
    std::memcpy(starts.data(), bank_ptr, starts.size()*sizeof(CSTMarker));
    bank_ptr += starts.size();
    std::vector<CSTMarker> ends(*bank_ptr++, CSTMarker(0));
    assert(ends.empty());
    std::vector<semantic_value_type> values(*bank_ptr++);
    std::memcpy(values.data(), bank_ptr, values.size()*sizeof(semantic_value_type));
    assert(values[0] == 0 && values.size() == 1);
    bank_ptr += values.size();
    std::vector<detail::StackEntryTag> tags(*bank_ptr++);
    std::memcpy(tags.data(), bank_ptr, tags.size()*sizeof(detail::StackEntryTag));
#else
    auto bank_base_ptr = reinterpret_cast<std::tuple<std::vector<CSTMarker>,
                                                     std::vector<CSTMarker>,
                                                     std::vector<semantic_value_type>,
                                                     std::vector<detail::StackEntryTag>>**>(acquire_bank());
    assert(bank_base_ptr != nullptr);
    auto& stack_tuple_base = **bank_base_ptr;
    auto& starts = std::get<0>(stack_tuple_base);
    auto& ends   = std::get<1>(stack_tuple_base);
    auto& values = std::get<2>(stack_tuple_base);
    auto& tags   = std::get<3>(stack_tuple_base);
#endif
    release_bank();

    void *current_bank;
    while ((current_bank = acquire_bank()) != nullptr) {
#if PYCENTAURUS
      auto bank_ptr = reinterpret_cast<uint64_t*>(current_bank);
      detail::ConstPtrRange<CSTMarker> starts_next(reinterpret_cast<CSTMarker*>(bank_ptr + 1), bank_ptr[0]);
      bank_ptr += starts_next.size() + 1;
      detail::ConstPtrRange<CSTMarker> ends_next(reinterpret_cast<CSTMarker*>(bank_ptr + 1), bank_ptr[0]);
      bank_ptr += ends_next.size() + 1;
      detail::ConstPtrRange<semantic_value_type> values_next(bank_ptr + 1, bank_ptr[0]);
      bank_ptr += values_next.size() + 1;
      detail::ConstPtrRange<detail::StackEntryTag> tags_next(reinterpret_cast<detail::StackEntryTag*>(bank_ptr + 1), bank_ptr[0]);
#else
      auto& stack_tuple = **reinterpret_cast<std::decay<decltype(stack_tuple_base)>::type**>(current_bank);
      auto& starts_next = std::get<0>(stack_tuple);
      auto& ends_next   = std::get<1>(stack_tuple);
      auto& values_next = std::get<2>(stack_tuple);
      auto& tags_next   = std::get<3>(stack_tuple);
#endif
      auto starts_next_it = starts_next.begin();
      auto ends_next_it   = ends_next.begin();
      auto values_next_it = values_next.begin();
      for (auto cur_tag : tags_next) {
        switch (cur_tag) {
        case detail::StackEntryTag::START_MARKER:
          push_start_marker(*starts_next_it++, starts, tags);
          break;
        case detail::StackEntryTag::END_MARKER: {
          assert(!starts.empty());
          reduce_by_end_marker(*ends_next_it++, starts, values, tags);
        } break;
        default:
          assert(detail::isValueTag(cur_tag));
          append_value(values_next_it, static_cast<int>(cur_tag), values, tags);
          break;
        }
      }
      assert(starts_next_it == starts_next.end());
      assert(ends_next_it == ends_next.end());
#if !PYCENTAURUS
      assert(values_next_it == values_next.end());
#endif
#if !PYCENTAURUS
      delete &stack_tuple;
#endif
      release_bank();
    }
    assert(starts.empty());
    assert(ends.empty());
    assert(values.size() <= 1);
    assert(tags.size() <= 1);

    auto result = (values.empty()) ? 0 : std::move(values.front());
#if !PYCENTAURUS
    delete &stack_tuple_base;
#endif
    return result;
  }